

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<void*>::addAll<void**,true>(ArrayBuilder<void*> *this,void **start,void **end)

{
  void **ppvVar1;
  void **end_local;
  void **start_local;
  ArrayBuilder<void_*> *this_local;
  
  ppvVar1 = kj::_::CopyConstructArray_<void_*,_void_**,_true,_false>::apply
                      (*(void ***)(this + 8),start,end);
  *(void ***)(this + 8) = ppvVar1;
  return;
}

Assistant:

void ArrayBuilder<T>::addAll(Iterator start, Iterator end) {
  pos = _::CopyConstructArray_<RemoveConst<T>, Decay<Iterator>, move>::apply(pos, start, end);
}